

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O0

void SetRemap(FRemapTable *table,int i,float r,float g,float b)

{
  BYTE BVar1;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_30;
  int local_2c;
  int local_28;
  int ib;
  int ig;
  int ir;
  float b_local;
  float g_local;
  float r_local;
  int i_local;
  FRemapTable *table_local;
  
  ig = (int)b;
  ir = (int)g;
  b_local = r;
  g_local = (float)i;
  _r_local = table;
  ib = clamp<int>((int)(r * 255.0),0,0xff);
  local_28 = clamp<int>((int)((float)ir * 255.0),0,0xff);
  local_2c = clamp<int>((int)((float)ig * 255.0),0,0xff);
  BVar1 = FColorMatcher::Pick(&ColorMatcher,ib,local_28,local_2c);
  _r_local->Remap[(int)g_local] = BVar1;
  PalEntry::PalEntry((PalEntry *)&local_30.field_0,0xff,(BYTE)ib,(BYTE)local_28,(BYTE)local_2c);
  _r_local->Palette[(int)g_local].field_0 = local_30;
  return;
}

Assistant:

static void SetRemap(FRemapTable *table, int i, float r, float g, float b)
{
	int ir = clamp (int(r * 255.f), 0, 255);
	int ig = clamp (int(g * 255.f), 0, 255);
	int ib = clamp (int(b * 255.f), 0, 255);
	table->Remap[i] = ColorMatcher.Pick (ir, ig, ib);
	table->Palette[i] = PalEntry(255, ir, ig, ib);
}